

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  byte bVar2;
  Mem *pVal;
  double dVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uint uVar16;
  char *zDate;
  byte *zDate_00;
  byte *pbVar17;
  double dVar18;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  int m;
  int h;
  int D;
  int M_1;
  int M;
  int Y;
  int local_cc;
  double local_b8;
  undefined4 local_88;
  int local_84;
  int local_80;
  int local_7c;
  DateTime local_78;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = sqlite3NotPureFunc(context);
    if (iVar5 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar5 = setDateTimeToCurrent(context,p);
        return iVar5;
      }
      goto LAB_001b68b1;
    }
    goto LAB_001b6880;
  }
  pVal = *argv;
  if ("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
      [pVal->flags & 0x3f] - 1 < 2) {
    dVar3 = sqlite3VdbeRealValue(pVal);
    p->s = dVar3;
    p->field_0x2c = p->field_0x2c | 1;
    if ((0.0 <= dVar3) && (dVar3 < 5373484.5)) {
      p->iJD = (long)(dVar3 * 86400000.0 + 0.5);
      p->validJD = '\x01';
    }
    goto LAB_001b59c2;
  }
  local_cc = 1;
  pcVar10 = (char *)sqlite3ValueText(pVal,'\x01');
  if (pcVar10 != (char *)0x0) {
    local_40 = (double)CONCAT44(local_40._4_4_,0xaaaaaaaa);
    local_7c = -0x55555556;
    local_80 = -0x55555556;
    cVar1 = *pcVar10;
    uVar19 = (ulong)(cVar1 == '-');
    iVar5 = getDigits(pcVar10 + uVar19,"40f-21a-21d");
    if (iVar5 == 3) {
      zDate = pcVar10 + uVar19 + 9;
      do {
        do {
          pbVar7 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar5 = parseHhMmSs(zDate,p);
      if (iVar5 != 0) {
        if (*zDate != '\0') goto LAB_001b58a2;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -local_40._0_4_;
      if (cVar1 != '-') {
        iVar5 = local_40._0_4_;
      }
      p->Y = iVar5;
      p->M = local_7c;
      p->D = local_80;
      computeFloor(p);
      if (p->tz != 0) {
        computeJD(p);
      }
    }
    else {
LAB_001b58a2:
      iVar5 = parseHhMmSs(pcVar10,p);
      if (iVar5 != 0) {
        lVar9 = 0;
        do {
          bVar4 = pcVar10[lVar9];
          if (bVar4 == "now"[lVar9]) {
            if ((ulong)bVar4 == 0) goto LAB_001b58e7;
          }
          else if (""[bVar4] != ""[(byte)"now"[lVar9]]) goto LAB_001b58f9;
          lVar9 = lVar9 + 1;
        } while( true );
      }
    }
    goto LAB_001b59c2;
  }
  goto switchD_001b5b95_caseD_62;
LAB_001b58e7:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 != 0) goto LAB_001b6867;
LAB_001b58f9:
  local_78.iJD = -1;
  sVar8 = strlen(pcVar10);
  iVar5 = sqlite3AtoF(pcVar10,(double *)&local_78,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar5 < 1) {
    lVar9 = 0;
    do {
      bVar4 = pcVar10[lVar9];
      if (bVar4 == "subsec"[lVar9]) {
        if ((ulong)bVar4 == 0) goto LAB_001b6855;
      }
      else if (""[bVar4] != ""[(byte)"subsec"[lVar9]]) {
        lVar9 = 0;
        goto LAB_001b6833;
      }
      lVar9 = lVar9 + 1;
    } while( true );
  }
  p->s = (double)local_78.iJD;
  p->field_0x2c = p->field_0x2c | 1;
  if ((0.0 <= (double)local_78.iJD) && ((double)local_78.iJD < 5373484.5)) {
    p->iJD = (long)((double)local_78.iJD * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
LAB_001b59c2:
  if (1 < argc) {
    uVar19 = 1;
    local_cc = 1;
LAB_001b59f1:
    pbVar7 = (byte *)sqlite3ValueText(argv[uVar19],'\x01');
    sqlite3ValueBytes(argv[uVar19],'\x01');
    if (pbVar7 != (byte *)0x0) {
      local_40 = -NAN;
      bVar4 = *pbVar7;
      uVar20 = (ulong)bVar4;
      bVar2 = ""[uVar20];
      if (bVar2 < 0x61) {
        if ((bVar2 < 0x3a) && ((0x3ff280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          local_7c = -0x55555556;
          local_80 = -0x55555556;
          local_84 = -0x55555556;
          local_88 = 0xaaaaaaaa;
          zDate_00 = pbVar7 + 1;
          uVar20 = 1;
          while( true ) {
            bVar2 = pbVar7[uVar20];
            if (((bVar2 == 0) || (bVar2 == 0x3a)) || ((""[bVar2] & 1) != 0)) break;
            if (bVar2 == 0x2d) {
              if ((int)uVar20 == 6) {
                iVar5 = getDigits((char *)zDate_00,"50f",&local_7c);
                if (iVar5 == 1) {
                  uVar13 = 6;
                  goto LAB_001b5b04;
                }
              }
              else if (((int)uVar20 == 5) &&
                      (iVar5 = getDigits((char *)zDate_00,"40f",&local_7c), iVar5 == 1)) {
                uVar13 = 5;
                goto LAB_001b5b04;
              }
            }
            uVar20 = uVar20 + 1;
          }
          uVar13 = uVar20 & 0xffffffff;
LAB_001b5b04:
          iVar5 = sqlite3AtoF((char *)pbVar7,&local_40,(int)uVar13,'\x01');
          if (iVar5 < 1) {
LAB_001b6401:
            iVar5 = 1;
          }
          else {
            pbVar17 = pbVar7;
            if (pbVar7[uVar20] == 0x2d) {
              if ((bVar4 == 0x2d) || (bVar4 == 0x2b)) {
                if ((int)uVar13 == 5) {
                  iVar5 = getDigits((char *)zDate_00,"40f-20a-20d",&local_7c,&local_80,&local_84);
                  zDate_00 = pbVar7;
                }
                else {
                  iVar5 = getDigits((char *)zDate_00,"50f-20a-20d",&local_7c,&local_80,&local_84);
                }
                iVar6 = local_80;
                iVar12 = local_84;
                if ((iVar5 == 3) && (local_84 < 0x1f && local_80 < 0xc)) {
                  computeYMD(p);
                  computeHMS(p);
                  p->validJD = '\0';
                  iVar5 = local_7c;
                  if (bVar4 == 0x2d) {
                    iVar6 = -iVar6;
                    iVar12 = -iVar12;
                    iVar5 = -local_7c;
                    local_84 = iVar12;
                  }
                  iVar6 = p->M + iVar6;
                  if (iVar6 < 1) {
                    uVar16 = -((0xcU - iVar6) / 0xc);
                  }
                  else {
                    uVar16 = (iVar6 - 1U) / 0xc;
                  }
                  p->Y = p->Y + iVar5 + uVar16;
                  p->M = iVar6 + uVar16 * -0xc;
                  computeFloor(p);
                  computeJD(p);
                  p->validYMD = '\0';
                  p->validHMS = '\0';
                  p->iJD = p->iJD + (long)iVar12 * 86400000;
                  if ((ulong)zDate_00[0xb] == 0) {
                    iVar5 = 0;
                    goto LAB_001b640c;
                  }
                  if ((""[zDate_00[0xb]] & 1) != 0) {
                    pbVar7 = zDate_00 + 0xc;
                    iVar5 = getDigits((char *)pbVar7,"20c:20e",&local_88);
                    uVar13 = 2;
                    pbVar17 = zDate_00;
                    if (iVar5 == 2) goto LAB_001b5bd6;
                  }
                }
              }
              goto LAB_001b6401;
            }
LAB_001b5bd6:
            if (pbVar7[uVar13] == 0x3a) {
              local_78.s = 0.0;
              local_78.validJD = '\0';
              local_78.validYMD = '\0';
              local_78.validHMS = '\0';
              local_78.nFloor = '\0';
              local_78._44_4_ = 0;
              local_78.D = 0;
              local_78.h = 0;
              local_78.m = 0;
              local_78.tz = 0;
              local_78.iJD = 0;
              local_78.Y = 0;
              local_78.M = 0;
              iVar6 = parseHhMmSs((char *)(pbVar7 + ((ulong)*pbVar7 - 0x3a < 0xfffffffffffffff6)),
                                  &local_78);
              iVar5 = 1;
              if (iVar6 == 0) {
                computeJD(&local_78);
                lVar11 = (local_78.iJD + -43200000) % 86400000;
                lVar9 = -lVar11;
                if (bVar4 != 0x2d) {
                  lVar9 = lVar11;
                }
                computeJD(p);
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->tz = 0;
                p->iJD = p->iJD + lVar9;
                iVar5 = 0;
              }
            }
            else {
              pbVar17 = pbVar17 + (uVar13 - 1);
              iVar5 = 1;
              do {
                pbVar7 = pbVar17 + 1;
                pbVar17 = pbVar17 + 1;
              } while ((""[*pbVar7] & 1) != 0);
              sVar8 = strlen((char *)pbVar17);
              uVar16 = (uint)sVar8 & 0x3fffffff;
              if (0xfffffff7 < uVar16 - 0xb) {
                if ((pbVar17[uVar16 - 1] & 0xdf) == 0x53) {
                  uVar16 = uVar16 - 1;
                }
                computeJD(p);
                local_b8 = local_40;
                dVar3 = *(double *)(&DAT_00208fe0 + (ulong)(local_40 < 0.0) * 8);
                p->nFloor = '\0';
                lVar11 = 0x205f51;
                lVar9 = 0;
                do {
                  if (uVar16 == aXformType[lVar9].nName) {
                    uVar20 = 0;
                    do {
                      if ((ulong)*(byte *)(lVar11 + uVar20) == 0) {
                        uVar15 = ""[pbVar17[uVar20]];
                        uVar14 = '\0';
LAB_001b5dd3:
                        if (uVar14 != uVar15) goto LAB_001b5e03;
                        break;
                      }
                      uVar14 = ""[*(byte *)(lVar11 + uVar20)];
                      uVar15 = ""[pbVar17[uVar20]];
                      if (uVar14 != uVar15) goto LAB_001b5dd3;
                      uVar20 = uVar20 + 1;
                    } while (uVar16 != uVar20);
                    if (((double)-aXformType[lVar9].rLimit < local_40) &&
                       (local_40 < (double)aXformType[lVar9].rLimit)) {
                      if ((int)lVar9 == 5) {
                        iVar5 = (int)local_40;
                        computeYMD(p);
                        computeHMS(p);
                        p->Y = p->Y + iVar5;
LAB_001b6722:
                        computeFloor(p);
                        p->validJD = '\0';
                        local_b8 = local_b8 - (double)(int)local_b8;
                      }
                      else if ((int)lVar9 == 4) {
                        computeYMD(p);
                        computeHMS(p);
                        iVar5 = p->M + (int)local_b8;
                        if (iVar5 == 0 || SCARRY4(p->M,(int)local_b8) != iVar5 < 0) {
                          uVar16 = -((0xcU - iVar5) / 0xc);
                        }
                        else {
                          uVar16 = (iVar5 - 1U) / 0xc;
                        }
                        p->Y = p->Y + uVar16;
                        p->M = iVar5 + uVar16 * -0xc;
                        goto LAB_001b6722;
                      }
                      computeJD(p);
                      p->iJD = p->iJD + (long)((double)aXformType[lVar9].rXform * local_b8 * 1000.0
                                              + dVar3);
                      iVar5 = 0;
                      goto LAB_001b6783;
                    }
                  }
LAB_001b5e03:
                  lVar9 = lVar9 + 1;
                  lVar11 = lVar11 + 0x10;
                } while (lVar9 != 6);
                iVar5 = 1;
LAB_001b6783:
                p->validYMD = '\0';
                p->validHMS = '\0';
                p->tz = 0;
              }
            }
          }
          goto LAB_001b640c;
        }
      }
      else if (bVar2 < 0x73) {
        switch(bVar2) {
        case 0x61:
          lVar9 = 0;
          do {
            if ((byte)uVar20 == "auto"[lVar9]) {
              if ((byte)uVar20 == 0) goto LAB_001b60dc;
            }
            else if (""[uVar20] != ""[(byte)"auto"[lVar9]]) break;
            uVar20 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        case 99:
          lVar9 = 0;
          do {
            if ((byte)uVar20 == "ceiling"[lVar9]) {
              if ((byte)uVar20 == 0) goto LAB_001b6135;
            }
            else if (""[uVar20] != ""[(byte)"ceiling"[lVar9]]) break;
            uVar20 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        case 0x66:
          lVar9 = 0;
          do {
            if ((byte)uVar20 == "floor"[lVar9]) {
              if ((byte)uVar20 == 0) goto LAB_001b60a7;
            }
            else if (""[uVar20] != ""[(byte)"floor"[lVar9]]) break;
            uVar20 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        case 0x6a:
          lVar9 = 0;
          do {
            if ((byte)uVar20 == "julianday"[lVar9]) {
              if ((byte)uVar20 == 0) goto LAB_001b6048;
            }
            else if (""[uVar20] != ""[(byte)"julianday"[lVar9]]) break;
            uVar20 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        case 0x6c:
          lVar9 = 0;
          do {
            if ((byte)uVar20 == "localtime"[lVar9]) {
              if ((byte)uVar20 == 0) goto LAB_001b606c;
            }
            else if (""[uVar20] != ""[(byte)"localtime"[lVar9]]) break;
            uVar20 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        }
      }
      else if (bVar2 == 0x73) {
        uVar14 = '\0';
        if (bVar4 == 0) {
          pcVar10 = "start of ";
        }
        else {
          lVar9 = 0;
          uVar13 = uVar20;
          do {
            lVar11 = lVar9;
            uVar14 = ""[uVar13];
            if (uVar14 != ""[(byte)"start of "[lVar11]]) {
              pcVar10 = "start of " + lVar11;
              goto LAB_001b6583;
            }
            if (lVar11 == 8) goto LAB_001b658e;
            uVar13 = (ulong)pbVar7[lVar11 + 1];
            lVar9 = lVar11 + 1;
          } while (pbVar7[lVar11 + 1] != 0);
          pcVar10 = "start of " + lVar11 + 1;
          uVar14 = '\0';
        }
LAB_001b6583:
        if (uVar14 != ""[(byte)*pcVar10]) {
          lVar9 = 0;
          uVar13 = uVar20;
          do {
            if ((byte)uVar13 == "subsec"[lVar9]) {
              if ((byte)uVar13 == 0) goto LAB_001b668d;
            }
            else if (""[uVar13] != ""[(byte)"subsec"[lVar9]]) {
              lVar9 = 0;
              goto LAB_001b665c;
            }
            uVar13 = (ulong)pbVar7[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while( true );
        }
LAB_001b658e:
        if (((p->validJD != '\0') || (p->validYMD != '\0')) || (p->validHMS != '\0')) {
          computeYMD(p);
          p->validHMS = '\x01';
          p->h = 0;
          p->m = 0;
          p->s = 0.0;
          p->field_0x2c = p->field_0x2c & 0xfe;
          p->tz = 0;
          p->validJD = '\0';
          lVar9 = 0;
          do {
            bVar4 = pbVar7[lVar9 + 9];
            if (bVar4 == "month"[lVar9]) {
              if ((ulong)bVar4 == 0) goto LAB_001b6623;
            }
            else if (""[bVar4] != ""[(byte)"month"[lVar9]]) {
              lVar9 = 0;
              goto LAB_001b6631;
            }
            lVar9 = lVar9 + 1;
          } while( true );
        }
      }
      else if (bVar2 == 0x77) {
        uVar14 = '\0';
        if (bVar4 == 0) {
          pcVar10 = "weekday ";
        }
        else {
          lVar9 = 0;
          do {
            lVar11 = lVar9;
            uVar14 = ""[uVar20];
            if (uVar14 != ""[(byte)"weekday "[lVar11]]) {
              pcVar10 = "weekday " + lVar11;
              goto LAB_001b643c;
            }
            if (lVar11 == 7) goto LAB_001b644b;
            uVar20 = (ulong)pbVar7[lVar11 + 1];
            lVar9 = lVar11 + 1;
          } while (pbVar7[lVar11 + 1] != 0);
          pcVar10 = "weekday " + lVar11 + 1;
          uVar14 = '\0';
        }
LAB_001b643c:
        if (uVar14 == ""[(byte)*pcVar10]) {
LAB_001b644b:
          sVar8 = strlen((char *)(pbVar7 + 8));
          iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),&local_40,(uint)sVar8 & 0x3fffffff,'\x01');
          if (((0 < iVar5) && (0.0 <= local_40)) && (local_40 < 7.0)) {
            if ((local_40 == (double)(int)local_40) &&
               (!NAN(local_40) && !NAN((double)(int)local_40))) {
              iVar5 = (int)local_40;
              computeYMD(p);
              computeHMS(p);
              p->tz = 0;
              p->validJD = '\0';
              computeJD(p);
              lVar9 = (p->iJD + 0x7b98a00) / 86400000;
              lVar11 = (lVar9 / 7) * -7 + -7 + lVar9;
              if (lVar9 % 7 <= (long)iVar5) {
                lVar11 = lVar9 % 7;
              }
              p->iJD = (iVar5 - lVar11) * 86400000 + p->iJD;
              p->validYMD = '\0';
              p->validHMS = '\0';
              p->tz = 0;
              goto LAB_001b6415;
            }
          }
        }
      }
      else if (bVar2 == 0x75) {
        lVar9 = 0;
        uVar13 = uVar20;
        do {
          if ((byte)uVar13 == "unixepoch"[lVar9]) {
            if ((byte)uVar13 == 0) goto LAB_001b6153;
          }
          else if (""[uVar13] != ""[(byte)"unixepoch"[lVar9]]) goto LAB_001b615e;
          uVar13 = (ulong)pbVar7[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while( true );
      }
    }
    goto switchD_001b5b95_caseD_62;
  }
LAB_001b6795:
  computeJD(p);
  local_cc = 1;
  if (((p->field_0x2c & 2) == 0) && ((ulong)p->iJD < 0x1a6401072fe00)) {
    if ((argc == 1) && (p->validYMD != '\0')) {
      local_cc = 0;
      if (0x1c < p->D) {
        p->validYMD = '\0';
      }
    }
    else {
      local_cc = 0;
    }
  }
  goto switchD_001b5b95_caseD_62;
LAB_001b6833:
  bVar4 = pcVar10[lVar9];
  if (bVar4 == "subsecond"[lVar9]) {
    if ((ulong)bVar4 == 0) goto LAB_001b6855;
  }
  else if (""[bVar4] != ""[(byte)"subsecond"[lVar9]]) goto LAB_001b6880;
  lVar9 = lVar9 + 1;
  goto LAB_001b6833;
LAB_001b665c:
  if ((byte)uVar20 == "subsecond"[lVar9]) {
    if ((byte)uVar20 == 0) goto LAB_001b668d;
  }
  else if (""[uVar20] != ""[(byte)"subsecond"[lVar9]]) goto switchD_001b5b95_caseD_62;
  uVar20 = (ulong)pbVar7[lVar9 + 1];
  lVar9 = lVar9 + 1;
  goto LAB_001b665c;
LAB_001b668d:
  p->field_0x2c = p->field_0x2c | 4;
  goto LAB_001b6415;
LAB_001b6631:
  bVar4 = pbVar7[lVar9 + 9];
  if (bVar4 == "year"[lVar9]) {
    if ((ulong)bVar4 == 0) goto LAB_001b6696;
  }
  else if (""[bVar4] != ""[(byte)"year"[lVar9]]) {
    lVar9 = 0;
    goto LAB_001b66ab;
  }
  lVar9 = lVar9 + 1;
  goto LAB_001b6631;
LAB_001b66ab:
  bVar4 = pbVar7[lVar9 + 9];
  if (bVar4 == "julianday"[lVar9 + 6]) {
    if ((ulong)bVar4 == 0) goto LAB_001b6415;
  }
  else if (""[bVar4] != ""[(byte)"julianday"[lVar9 + 6]]) goto switchD_001b5b95_caseD_62;
  lVar9 = lVar9 + 1;
  goto LAB_001b66ab;
LAB_001b6696:
  p->M = 1;
  p->D = 1;
  goto LAB_001b6415;
LAB_001b6623:
  p->D = 1;
  goto LAB_001b6415;
LAB_001b6153:
  bVar4 = p->field_0x2c;
  if ((bVar4 & 1) == 0) {
LAB_001b615e:
    lVar9 = 0;
    do {
      if ((byte)uVar20 == "utc"[lVar9]) {
        if ((byte)uVar20 == 0) goto LAB_001b61a9;
      }
      else if (""[uVar20] != ""[(byte)"utc"[lVar9]]) goto switchD_001b5b95_caseD_62;
      uVar20 = (ulong)pbVar7[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while( true );
  }
  if (((1 < uVar19) || (dVar3 = p->s * 1000.0 + 210866760000000.0, dVar3 < 0.0)) ||
     (464269060800000.0 <= dVar3)) goto switchD_001b5b95_caseD_62;
LAB_001b62de:
  p->validHMS = '\0';
  p->tz = 0;
  p->iJD = (long)(dVar3 + 0.5);
  p->validJD = '\x01';
  p->validYMD = '\0';
  goto LAB_001b6300;
LAB_001b61a9:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 == 0) goto switchD_001b5b95_caseD_62;
  if ((p->field_0x2c & 8) == 0) {
    computeJD(p);
    dVar3 = (double)p->iJD;
    lVar9 = 0;
    dVar18 = dVar3;
    uVar16 = 0;
    do {
      dVar18 = (double)((long)dVar18 - lVar9);
      local_78.m = 0;
      local_78.tz = 0;
      local_78.s = 0.0;
      local_78.Y = 0;
      local_78.M = 0;
      local_78.D = 0;
      local_78.h = 0;
      local_78.validJD = '\x01';
      local_78.validYMD = '\0';
      local_78.validHMS = '\0';
      local_78.nFloor = '\0';
      local_78._44_4_ = 0;
      local_78.iJD = (sqlite3_int64)dVar18;
      iVar5 = toLocaltime(&local_78,context);
      if (iVar5 != 0) goto switchD_001b5b95_caseD_62;
      computeJD(&local_78);
      lVar9 = local_78.iJD - (long)dVar3;
    } while ((lVar9 != 0) && (bVar21 = uVar16 < 3, uVar16 = uVar16 + 1, bVar21));
    p->iJD = 0;
    p->Y = 0;
    p->M = 0;
    p->s = 0.0;
    p->validJD = '\0';
    p->validYMD = '\0';
    p->validHMS = '\0';
    p->nFloor = '\0';
    *(undefined4 *)&p->field_0x2c = 0;
    p->D = 0;
    p->h = 0;
    p->m = 0;
    p->tz = 0;
    p->iJD = (sqlite3_int64)dVar18;
    p->validJD = '\x01';
    p->field_0x2c = p->field_0x2c & 0xe7 | 8;
  }
  goto LAB_001b6415;
LAB_001b606c:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 == 0) goto switchD_001b5b95_caseD_62;
  bVar4 = p->field_0x2c;
  iVar5 = 0;
  if ((bVar4 & 0x10) == 0) {
    iVar5 = toLocaltime(p,context);
    bVar4 = p->field_0x2c;
  }
  p->field_0x2c = bVar4 & 0xe7 | 0x10;
LAB_001b640c:
  if (iVar5 != 0) goto switchD_001b5b95_caseD_62;
LAB_001b6415:
  uVar19 = uVar19 + 1;
  if (uVar19 == (uint)argc) goto LAB_001b6795;
  goto LAB_001b59f1;
LAB_001b6048:
  if (((1 < uVar19) || (p->validJD == '\0')) || (bVar4 = p->field_0x2c, (bVar4 & 1) == 0))
  goto switchD_001b5b95_caseD_62;
  goto LAB_001b6300;
LAB_001b60a7:
  computeJD(p);
  p->iJD = p->iJD - ((long)p->nFloor * 0x5265c0000000000 >> 0x20);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  goto LAB_001b6415;
LAB_001b6135:
  computeJD(p);
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->tz = 0;
  p->nFloor = '\0';
  goto LAB_001b6415;
LAB_001b60dc:
  if (1 < uVar19) goto switchD_001b5b95_caseD_62;
  bVar4 = p->field_0x2c;
  if (((bVar4 & 1) != 0) && (p->validJD == '\0')) {
    dVar3 = p->s;
    if ((dVar3 < -210866760000.0) || (253402300799.0 < dVar3)) goto LAB_001b6415;
    dVar3 = dVar3 * 1000.0 + 210866760000000.0;
    goto LAB_001b62de;
  }
LAB_001b6300:
  p->field_0x2c = bVar4 & 0xfe;
  goto LAB_001b6415;
LAB_001b6855:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 == 0) {
LAB_001b6880:
    local_cc = 1;
  }
  else {
    p->field_0x2c = p->field_0x2c | 4;
LAB_001b6867:
    iVar5 = setDateTimeToCurrent(context,p);
    if (iVar5 == 0) goto LAB_001b59c2;
  }
switchD_001b5b95_caseD_62:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_cc;
  }
LAB_001b68b1:
  __stack_chk_fail();
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}